

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_BigThreeDragons_Test::testBody
          (TEST_DoublingFactorCounterTest_BigThreeDragons_Test *this)

{
  size_type sVar1;
  size_type sVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  unsigned_long in_stack_fffffffffffffc98;
  undefined4 uVar8;
  NormalTestTerminator *pNVar6;
  undefined8 uVar7;
  int value;
  NormalTestTerminator local_1b0;
  NormalTestTerminator local_1a8;
  SimpleString local_1a0;
  SimpleString local_198;
  NormalTestTerminator local_190;
  NormalTestTerminator local_188;
  key_type local_17c;
  SimpleString local_178;
  SimpleString local_170;
  key_type local_164 [3];
  NormalTestTerminator local_158;
  NormalTestTerminator local_150;
  key_type local_144;
  SimpleString local_140;
  SimpleString local_138;
  key_type local_12c [3];
  NormalTestTerminator local_120;
  NormalTestTerminator local_118;
  key_type local_10c;
  SimpleString local_108;
  SimpleString local_100;
  key_type local_f4 [3];
  NormalTestTerminator local_e8;
  NormalTestTerminator local_e0;
  key_type local_d4;
  SimpleString local_d0;
  SimpleString local_c8;
  key_type local_bc [6];
  key_type local_a4;
  undefined1 local_a0 [8];
  DoublingFactorReport r;
  TEST_DoublingFactorCounterTest_BigThreeDragons_Test *this_local;
  
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,WestWind);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,WhiteDragon,true);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,RedDragon,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,GreenDragon,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,TwoOfCharacters,false);
  r.doubling_factor = 0;
  mahjong::WiningState::selfDrawn
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s,
             (SelfDrawnSituation)0x0);
  mahjong::DoubligFactorCounter::report
            ((DoublingFactorReport *)local_a0,
             &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c);
  local_a4 = BigThreeDragons;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,&local_a4);
  if (sVar1 == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_e8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_e8;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x335);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ae5ff);
  }
  else {
    local_bc[1] = 0x2d;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_bc + 1);
    local_bc[0] = BigThreeDragons;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_bc);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x335);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)(in_stack_fffffffffffffc98 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_c8);
    local_d4 = BigThreeDragons;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_d4);
    StringFrom(in_stack_fffffffffffffc98);
    uVar8 = (undefined4)(in_stack_fffffffffffffc98 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_d0);
    local_e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_e0);
    pNVar6 = (NormalTestTerminator *)CONCAT44(uVar8,0x335);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,pNVar6,&local_e0);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ae513);
    SimpleString::~SimpleString((SimpleString *)0x1ae51f);
    SimpleString::~SimpleString((SimpleString *)0x1ae52b);
  }
  local_f4[2] = 0xb;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_f4 + 2);
  if (sVar1 == 0) {
    pUVar3 = UtestShell::getCurrent();
    local_120.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_120;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x336);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ae8c8);
  }
  else {
    local_f4[1] = 0xb;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_f4 + 1);
    local_f4[0] = WhiteDragon;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_f4);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x336);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)((ulong)pNVar6 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_100);
    local_10c = WhiteDragon;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_10c);
    StringFrom((unsigned_long)pNVar6);
    uVar8 = (undefined4)((ulong)pNVar6 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_108);
    local_118.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_118);
    pNVar6 = (NormalTestTerminator *)CONCAT44(uVar8,0x336);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,pNVar6,&local_118);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ae7dc);
    SimpleString::~SimpleString((SimpleString *)0x1ae7e8);
    SimpleString::~SimpleString((SimpleString *)0x1ae7f4);
  }
  local_12c[2] = 0xd;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_12c + 2);
  if (sVar1 == 0) {
    pUVar3 = UtestShell::getCurrent();
    local_158.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_158;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x337);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1aeb91);
  }
  else {
    local_12c[1] = 0xd;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_12c + 1);
    local_12c[0] = RedDragon;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_12c);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x337);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)((ulong)pNVar6 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_138);
    local_144 = RedDragon;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_144);
    StringFrom((unsigned_long)pNVar6);
    uVar8 = (undefined4)((ulong)pNVar6 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_140);
    local_150.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_150);
    pNVar6 = (NormalTestTerminator *)CONCAT44(uVar8,0x337);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,pNVar6,&local_150);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1aeaa5);
    SimpleString::~SimpleString((SimpleString *)0x1aeab1);
    SimpleString::~SimpleString((SimpleString *)0x1aeabd);
  }
  local_164[2] = 0xc;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_164 + 2);
  if (sVar1 == 0) {
    pUVar3 = UtestShell::getCurrent();
    local_190.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_190;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x338);
    value = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1aee5a);
  }
  else {
    local_164[1] = 0xc;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_164 + 1);
    local_164[0] = GreenDragon;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_164);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x338);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)((ulong)pNVar6 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_170);
    local_17c = GreenDragon;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_17c);
    StringFrom((unsigned_long)pNVar6);
    uVar8 = (undefined4)((ulong)pNVar6 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_178);
    local_188.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_188);
    uVar7 = CONCAT44(uVar8,0x338);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,uVar7,&local_188);
    value = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1aed6e);
    SimpleString::~SimpleString((SimpleString *)0x1aed7a);
    SimpleString::~SimpleString((SimpleString *)0x1aed86);
  }
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 100) {
    pUVar3 = UtestShell::getCurrent();
    local_1b0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_1b0);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x339,&local_1b0);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1af087);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_198);
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_1a0);
    local_1a8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_1a8);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,CONCAT44(value,0x339),&local_1a8);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1aef9b);
    SimpleString::~SimpleString((SimpleString *)0x1aefa7);
    SimpleString::~SimpleString((SimpleString *)0x1aefb3);
  }
  mahjong::DoublingFactorReport::~DoublingFactorReport((DoublingFactorReport *)local_a0);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, BigThreeDragons)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::WhiteDragon, true);
	addTriplet(Tile::RedDragon, false);
	addTriplet(Tile::GreenDragon, false);
	addSequence(Tile::TwoOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::BigThreeDragons));
	CHECK_EQUAL(0, r.patterns.count(Pattern::WhiteDragon));
	CHECK_EQUAL(0, r.patterns.count(Pattern::RedDragon));
	CHECK_EQUAL(0, r.patterns.count(Pattern::GreenDragon));
	CHECK_EQUAL(100, r.doubling_factor);
}